

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::init(VertexArrayObjectTest *this,EVP_PKEY_CTX *ctx)

{
  Random *rnd;
  ostringstream *poVar1;
  float fVar2;
  int iVar3;
  iterator __position;
  int iVar4;
  float fVar5;
  deUint32 dVar6;
  GLenum GVar7;
  int iVar8;
  pointer pBVar9;
  float *data;
  ShaderProgram *pSVar10;
  TestError *this_00;
  int iVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  int iVar15;
  float fVar16;
  GLuint buffer;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pBVar9 = (this->m_spec).buffers.
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_spec).buffers.
                              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9) >> 3) *
          -0x33333333) {
    rnd = &this->m_random;
    lVar12 = 0;
    do {
      pBVar9 = pBVar9 + lVar12;
      data = (float *)operator_new__((long)pBVar9->size);
      iVar8 = pBVar9->stride;
      if (iVar8 == 0) {
        switch(pBVar9->type) {
        case 0x1400:
        case 0x1401:
          iVar8 = pBVar9->componentCount;
          break;
        case 0x1402:
        case 0x1403:
          iVar8 = pBVar9->componentCount * 2;
          break;
        case 0x1404:
        case 0x1405:
        case 0x1406:
          iVar8 = pBVar9->componentCount << 2;
          break;
        default:
          iVar8 = 0;
        }
      }
      iVar15 = pBVar9->count;
      if (0 < iVar15) {
        iVar4 = pBVar9->componentCount;
        iVar11 = 0;
        pfVar14 = data;
        do {
          if (0 < iVar4) {
            iVar15 = 0;
            pfVar13 = pfVar14;
            do {
              switch(pBVar9->type) {
              case 0x1400:
              case 0x1401:
                iVar4 = pBVar9->intRangeMin;
                iVar3 = pBVar9->intRangeMax;
                dVar6 = deRandom_getUint32(&rnd->m_rnd);
                if (iVar3 != 0x7fffffff || iVar4 != -0x80000000) {
                  dVar6 = dVar6 % ((iVar3 - iVar4) + 1U) + iVar4;
                }
                *(char *)pfVar13 = (char)dVar6;
                pfVar13 = (float *)((long)pfVar13 + 1);
                break;
              case 0x1402:
              case 0x1403:
                iVar4 = pBVar9->intRangeMin;
                iVar3 = pBVar9->intRangeMax;
                dVar6 = deRandom_getUint32(&rnd->m_rnd);
                if (iVar3 != 0x7fffffff || iVar4 != -0x80000000) {
                  dVar6 = dVar6 % ((iVar3 - iVar4) + 1U) + iVar4;
                }
                *(short *)pfVar13 = (short)dVar6;
                pfVar13 = (float *)((long)pfVar13 + 2);
                break;
              case 0x1404:
              case 0x1405:
                iVar4 = pBVar9->intRangeMin;
                iVar3 = pBVar9->intRangeMax;
                fVar5 = (float)deRandom_getUint32(&rnd->m_rnd);
                if (iVar3 != 0x7fffffff || iVar4 != -0x80000000) {
                  fVar5 = (float)((uint)fVar5 % ((iVar3 - iVar4) + 1U) + iVar4);
                }
                *pfVar13 = fVar5;
                goto LAB_011850cf;
              case 0x1406:
                fVar5 = pBVar9->floatRangeMin;
                fVar2 = pBVar9->floatRangeMax;
                fVar16 = deRandom_getFloat(&rnd->m_rnd);
                *pfVar13 = fVar16 * (fVar2 - fVar5) + fVar5;
LAB_011850cf:
                pfVar13 = pfVar13 + 1;
              }
              iVar15 = iVar15 + 1;
              iVar4 = pBVar9->componentCount;
            } while (iVar15 < iVar4);
            iVar15 = pBVar9->count;
          }
          pfVar14 = (float *)((long)pfVar14 + (long)iVar8);
          iVar11 = iVar11 + 1;
        } while (iVar11 < iVar15);
      }
      glwGenBuffers(1,(GLuint *)local_1b0);
      GVar7 = glwGetError();
      glu::checkError(GVar7,"glGenBuffers(1, &buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0xe5);
      __position._M_current =
           (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_buffers,__position,
                   (uint *)local_1b0);
      }
      else {
        *__position._M_current = local_1b0._0_4_;
        (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      glwBindBuffer(0x8892,local_1b0._0_4_);
      GVar7 = glwGetError();
      glu::checkError(GVar7,"glBindBuffer(GL_ARRAY_BUFFER, buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0xe8);
      glwBufferData(0x8892,(long)(this->m_spec).buffers.
                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar12].size,data,0x88e8)
      ;
      GVar7 = glwGetError();
      glu::checkError(GVar7,
                      "glBufferData(GL_ARRAY_BUFFER, m_spec.buffers[bufferNdx].size, data, GL_DYNAMIC_DRAW)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0xe9);
      glwBindBuffer(0x8892,0);
      GVar7 = glwGetError();
      glu::checkError(GVar7,"glBindBuffer(GL_ARRAY_BUFFER, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0xea);
      operator_delete__(data);
      lVar12 = lVar12 + 1;
      pBVar9 = (this->m_spec).buffers.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(this->m_spec).buffers.
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9)
                           >> 3) * -0x33333333);
  }
  pSVar10 = createProgram(this,&(this->m_spec).vao);
  this->m_vaoProgram = pSVar10;
  local_1b0._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Program used with Vertex Array Object",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  glu::operator<<(this->m_log,this->m_vaoProgram);
  pSVar10 = createProgram(this,&(this->m_spec).state);
  this->m_stateProgram = pSVar10;
  local_1b0._0_8_ = this->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Program used with Vertex Array State",0x24);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  glu::operator<<(this->m_log,this->m_stateProgram);
  if (((this->m_vaoProgram->m_program).m_info.linkOk == true) &&
     (pSVar10 = this->m_stateProgram, (pSVar10->m_program).m_info.linkOk != false)) {
    if (((this->m_spec).useDrawElements == true) &&
       (((this->m_spec).vao.elementArrayBuffer == 0 ||
        ((this->m_spec).state.elementArrayBuffer == 0)))) {
      pSVar10 = (ShaderProgram *)generateIndices(this);
      this->m_indices = (deUint8 *)pSVar10;
    }
    return (int)pSVar10;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to compile shaders",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
             ,0xfc);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void VertexArrayObjectTest::init (void)
{
	// \note [mika] Index 0 is reserved for 0 buffer
	for (int bufferNdx = 0; bufferNdx < (int)m_spec.buffers.size(); bufferNdx++)
	{
		deUint8* data = createRandomBufferData(m_spec.buffers[bufferNdx]);

		try
		{
			GLuint buffer;
			GLU_CHECK_CALL(glGenBuffers(1, &buffer));
			m_buffers.push_back(buffer);

			GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, buffer));
			GLU_CHECK_CALL(glBufferData(GL_ARRAY_BUFFER, m_spec.buffers[bufferNdx].size, data, GL_DYNAMIC_DRAW));
			GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, 0));

		} catch (...) {
			delete[] data;
			throw;
		}

		delete[] data;
	}

	m_vaoProgram	= createProgram(m_spec.vao);
	m_log << tcu::TestLog::Message << "Program used with Vertex Array Object" << tcu::TestLog::EndMessage;
	m_log << *m_vaoProgram;
	m_stateProgram	= createProgram(m_spec.state);
	m_log << tcu::TestLog::Message << "Program used with Vertex Array State" << tcu::TestLog::EndMessage;
	m_log << *m_stateProgram;

	if (!m_vaoProgram->isOk() || !m_stateProgram->isOk())
		TCU_FAIL("Failed to compile shaders");

	if (m_spec.useDrawElements && (m_spec.vao.elementArrayBuffer == 0 || m_spec.state.elementArrayBuffer == 0))
		m_indices = generateIndices();
}